

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O1

void __thiscall ChaCha20Aligned::Keystream(ChaCha20Aligned *this,Span<std::byte> output)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  undefined4 uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint32_t uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  long in_FS_OFFSET;
  uint local_e4;
  byte *local_d0;
  ulong local_c8;
  
  local_d0 = output.m_data;
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1  [16])output & (undefined1  [16])0x3f) != (undefined1  [16])0x0) {
    __assert_fail("blocks * BLOCKLEN == output.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0x40,"void ChaCha20Aligned::Keystream(Span<std::byte>)");
  }
  if (0x3f < output.m_size) {
    local_c8 = output.m_size >> 6;
    uVar8 = this->input[0];
    uVar9 = this->input[1];
    uVar10 = this->input[2];
    uVar11 = this->input[3];
    uVar1 = this->input[4];
    uVar2 = this->input[5];
    uVar3 = this->input[6];
    uVar4 = this->input[7];
    local_e4 = this->input[8];
    uVar5 = this->input[10];
    uVar6 = this->input[2];
    uVar27 = uVar6 + 0x79622d32 ^ uVar5;
    uVar28 = uVar27 << 0x10 | uVar27 >> 0x10;
    uVar27 = this->input[0xb];
    uVar13 = uVar3 + uVar28;
    uVar34 = uVar13 ^ uVar6;
    uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
    uVar16 = uVar34 + uVar6 + 0x79622d32;
    uVar28 = uVar28 ^ uVar16;
    uVar29 = uVar28 << 8 | uVar28 >> 0x18;
    uVar13 = uVar13 + uVar29;
    uVar34 = uVar34 ^ uVar13;
    uVar35 = uVar34 << 7 | uVar34 >> 0x19;
    uVar6 = this->input[3];
    uVar28 = uVar6 + 0x6b206574 ^ uVar27;
    uVar28 = uVar28 << 0x10 | uVar28 >> 0x10;
    uVar23 = uVar4 + uVar28;
    uVar34 = uVar23 ^ uVar6;
    uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
    uVar30 = uVar34 + uVar6 + 0x6b206574;
    uVar28 = uVar28 ^ uVar30;
    uVar14 = uVar28 << 8 | uVar28 >> 0x18;
    uVar23 = uVar23 + uVar14;
    uVar34 = uVar34 ^ uVar23;
    uVar25 = uVar34 << 7 | uVar34 >> 0x19;
    uVar16 = uVar16 + uVar25;
    uVar36 = this->input[9];
    uVar6 = this->input[0];
    uVar28 = this->input[1];
    uVar34 = uVar6 + 0x61707865;
    uVar12 = uVar28 + 0x3320646e;
    while( true ) {
      local_c8 = local_c8 - 1;
      uVar18 = local_e4 ^ uVar34;
      uVar19 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar37 = uVar1 + uVar19;
      uVar18 = uVar37 ^ uVar6;
      uVar18 = uVar18 << 0xc | uVar18 >> 0x14;
      uVar20 = uVar18 + uVar34;
      uVar19 = uVar19 ^ uVar20;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar37 = uVar37 + uVar19;
      uVar18 = uVar18 ^ uVar37;
      uVar17 = uVar18 << 7 | uVar18 >> 0x19;
      uVar18 = uVar36 ^ uVar12;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar39 = uVar18 + uVar2;
      uVar31 = uVar39 ^ uVar28;
      uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
      uVar15 = uVar31 + uVar12;
      uVar18 = uVar18 ^ uVar15;
      uVar21 = uVar18 << 8 | uVar18 >> 0x18;
      uVar39 = uVar39 + uVar21;
      uVar31 = uVar31 ^ uVar39;
      uVar32 = uVar31 << 7 | uVar31 >> 0x19;
      uVar20 = uVar20 + uVar32;
      uVar18 = uVar20 ^ uVar14;
      uVar31 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar18 = uVar13 + uVar31;
      uVar32 = uVar32 ^ uVar18;
      uVar32 = uVar32 << 0xc | uVar32 >> 0x14;
      uVar20 = uVar20 + uVar32;
      uVar31 = uVar31 ^ uVar20;
      uVar24 = uVar31 << 8 | uVar31 >> 0x18;
      uVar18 = uVar18 + uVar24;
      uVar32 = uVar32 ^ uVar18;
      uVar33 = uVar32 << 7 | uVar32 >> 0x19;
      uVar15 = uVar15 + uVar35;
      uVar19 = uVar19 ^ uVar15;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar31 = uVar23 + uVar19;
      uVar32 = uVar31 ^ uVar35;
      uVar40 = uVar32 << 0xc | uVar32 >> 0x14;
      uVar15 = uVar15 + uVar40;
      uVar19 = uVar19 ^ uVar15;
      uVar32 = uVar19 << 8 | uVar19 >> 0x18;
      uVar31 = uVar31 + uVar32;
      uVar40 = uVar40 ^ uVar31;
      uVar41 = uVar40 << 7 | uVar40 >> 0x19;
      uVar21 = uVar21 ^ uVar16;
      uVar40 = uVar21 << 0x10 | uVar21 >> 0x10;
      uVar37 = uVar37 + uVar40;
      uVar19 = uVar37 ^ uVar25;
      uVar21 = uVar19 << 0xc | uVar19 >> 0x14;
      uVar19 = uVar21 + uVar16;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar26 = uVar17 + uVar30;
      uVar38 = uVar26 ^ uVar29;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar20 = uVar20 + uVar17;
      uVar32 = uVar32 ^ uVar20;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar37 = uVar37 + uVar32;
      uVar17 = uVar17 ^ uVar37;
      uVar17 = uVar17 << 7 | uVar17 >> 0x19;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar15 = uVar15 + uVar33;
      uVar40 = uVar40 ^ uVar15;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar39 = uVar39 + uVar40;
      uVar33 = uVar33 ^ uVar39;
      uVar33 = uVar33 << 7 | uVar33 >> 0x19;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar19 = uVar19 + uVar41;
      uVar38 = uVar38 ^ uVar19;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar18 = uVar18 + uVar38;
      uVar41 = uVar41 ^ uVar18;
      uVar41 = uVar41 << 7 | uVar41 >> 0x19;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar26 = uVar26 + uVar21;
      uVar24 = uVar24 ^ uVar26;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar21 = uVar21 ^ uVar31;
      uVar21 = uVar21 << 7 | uVar21 >> 0x19;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
      uVar20 = uVar20 + uVar33;
      uVar24 = uVar24 ^ uVar20;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar18 = uVar18 + uVar24;
      uVar33 = uVar33 ^ uVar18;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar41 = uVar41 << 0xc | uVar41 >> 0x14;
      uVar15 = uVar15 + uVar41;
      uVar32 = uVar32 ^ uVar15;
      uVar32 = uVar32 << 8 | uVar32 >> 0x18;
      uVar31 = uVar31 + uVar32;
      uVar41 = uVar41 ^ uVar31;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 0x10 | uVar40 >> 0x10;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar21 = uVar21 << 0xc | uVar21 >> 0x14;
      uVar19 = uVar19 + uVar21;
      uVar40 = uVar40 ^ uVar19;
      uVar40 = uVar40 << 8 | uVar40 >> 0x18;
      uVar37 = uVar37 + uVar40;
      uVar21 = uVar21 ^ uVar37;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 0x10 | uVar38 >> 0x10;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
      uVar26 = uVar26 + uVar17;
      uVar38 = uVar38 ^ uVar26;
      uVar38 = uVar38 << 8 | uVar38 >> 0x18;
      uVar39 = uVar39 + uVar38;
      uVar17 = uVar17 ^ uVar39;
      uVar22 = uVar40 + uVar36;
      uVar36 = (local_e4 == 0xffffffff) + uVar36;
      *(uint *)local_d0 = uVar20 + 0x61707865;
      *(uint *)(local_d0 + 4) = uVar15 + 0x3320646e;
      *(uint *)(local_d0 + 8) = uVar19 + 0x79622d32;
      *(uint *)(local_d0 + 0xc) = uVar26 + 0x6b206574;
      *(uint *)(local_d0 + 0x10) = (uVar17 << 7 | uVar17 >> 0x19) + uVar8;
      *(uint *)(local_d0 + 0x14) = (uVar33 << 7 | uVar33 >> 0x19) + uVar9;
      *(uint *)(local_d0 + 0x18) = (uVar41 << 7 | uVar41 >> 0x19) + uVar10;
      *(uint *)(local_d0 + 0x1c) = (uVar21 << 7 | uVar21 >> 0x19) + uVar11;
      *(uint *)(local_d0 + 0x20) = uVar37 + uVar1;
      *(uint *)(local_d0 + 0x24) = uVar39 + uVar2;
      *(uint *)(local_d0 + 0x28) = uVar18 + uVar3;
      *(uint *)(local_d0 + 0x2c) = uVar31 + uVar4;
      *(uint *)(local_d0 + 0x30) = uVar32 + local_e4;
      *(undefined4 *)(local_d0 + 0x34) = uVar22;
      *(uint *)(local_d0 + 0x38) = uVar38 + uVar5;
      *(uint *)(local_d0 + 0x3c) = uVar24 + uVar27;
      if (local_c8 == 0) break;
      local_d0 = local_d0 + 0x40;
      local_e4 = local_e4 + 1;
    }
    this->input[8] = local_e4 + 1;
    this->input[9] = uVar36;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar7) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void ChaCha20Aligned::Keystream(Span<std::byte> output) noexcept
{
    unsigned char* c = UCharCast(output.data());
    size_t blocks = output.size() / BLOCKLEN;
    assert(blocks * BLOCKLEN == output.size());

    uint32_t x0, x1, x2, x3, x4, x5, x6, x7, x8, x9, x10, x11, x12, x13, x14, x15;
    uint32_t j4, j5, j6, j7, j8, j9, j10, j11, j12, j13, j14, j15;

    if (!blocks) return;

    j4 = input[0];
    j5 = input[1];
    j6 = input[2];
    j7 = input[3];
    j8 = input[4];
    j9 = input[5];
    j10 = input[6];
    j11 = input[7];
    j12 = input[8];
    j13 = input[9];
    j14 = input[10];
    j15 = input[11];

    for (;;) {
        x0 = 0x61707865;
        x1 = 0x3320646e;
        x2 = 0x79622d32;
        x3 = 0x6b206574;
        x4 = j4;
        x5 = j5;
        x6 = j6;
        x7 = j7;
        x8 = j8;
        x9 = j9;
        x10 = j10;
        x11 = j11;
        x12 = j12;
        x13 = j13;
        x14 = j14;
        x15 = j15;

        // The 20 inner ChaCha20 rounds are unrolled here for performance.
        REPEAT10(
            QUARTERROUND( x0, x4, x8,x12);
            QUARTERROUND( x1, x5, x9,x13);
            QUARTERROUND( x2, x6,x10,x14);
            QUARTERROUND( x3, x7,x11,x15);
            QUARTERROUND( x0, x5,x10,x15);
            QUARTERROUND( x1, x6,x11,x12);
            QUARTERROUND( x2, x7, x8,x13);
            QUARTERROUND( x3, x4, x9,x14);
        );

        x0 += 0x61707865;
        x1 += 0x3320646e;
        x2 += 0x79622d32;
        x3 += 0x6b206574;
        x4 += j4;
        x5 += j5;
        x6 += j6;
        x7 += j7;
        x8 += j8;
        x9 += j9;
        x10 += j10;
        x11 += j11;
        x12 += j12;
        x13 += j13;
        x14 += j14;
        x15 += j15;

        ++j12;
        if (!j12) ++j13;

        WriteLE32(c + 0, x0);
        WriteLE32(c + 4, x1);
        WriteLE32(c + 8, x2);
        WriteLE32(c + 12, x3);
        WriteLE32(c + 16, x4);
        WriteLE32(c + 20, x5);
        WriteLE32(c + 24, x6);
        WriteLE32(c + 28, x7);
        WriteLE32(c + 32, x8);
        WriteLE32(c + 36, x9);
        WriteLE32(c + 40, x10);
        WriteLE32(c + 44, x11);
        WriteLE32(c + 48, x12);
        WriteLE32(c + 52, x13);
        WriteLE32(c + 56, x14);
        WriteLE32(c + 60, x15);

        if (blocks == 1) {
            input[8] = j12;
            input[9] = j13;
            return;
        }
        blocks -= 1;
        c += BLOCKLEN;
    }
}